

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cpp
# Opt level: O2

void __thiscall mjs::print_visitor::operator()(print_visitor *this,prefix_expression *e)

{
  token_type tt;
  wostream *pwVar1;
  char *pcVar2;
  
  tt = e->op_;
  pwVar1 = this->os_;
  if (tt == void_) {
    pcVar2 = "void ";
  }
  else if (tt == new_) {
    pcVar2 = "new ";
  }
  else if (tt == typeof_) {
    pcVar2 = "typeof ";
  }
  else if (tt == delete_) {
    pcVar2 = "delete ";
  }
  else {
    pcVar2 = op_text(tt);
  }
  std::operator<<(pwVar1,pcVar2);
  accept<mjs::print_visitor>
            ((e->e_)._M_t.
             super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>._M_t.
             super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
             super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl,this);
  return;
}

Assistant:

void operator()(const prefix_expression& e) {
        switch (e.op()) {
        case token_type::delete_: os_ << "delete "; break;
        case token_type::typeof_: os_ << "typeof "; break;
        case token_type::void_:   os_ << "void "; break;
        case token_type::new_:    os_ << "new "; break;
        default:                  os_ << op_text(e.op());
        }
        accept(e.e(), *this);
    }